

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dgMeshEffect.cpp
# Opt level: O1

dgConvexHull3d * __thiscall
dgMeshEffect::CreateConvexHull(dgMeshEffect *this,HaF64 tolerance,HaI32 maxVertexCount)

{
  dgBigVector *pdVar1;
  HaF64 *pHVar2;
  int iVar3;
  dgTreeNode *this_00;
  HaF64 HVar4;
  HaF64 HVar5;
  HaF64 HVar6;
  HaF64 *vertexCloud;
  dgRedBackNode *pdVar7;
  dgConvexHull3d *this_01;
  dgRedBackNode *pdVar8;
  int iVar9;
  int count;
  Iterator iter;
  Iterator local_40;
  
  iVar3 = *(int *)&(this->super_dgRefCounter).field_0xc;
  vertexCloud = (HaF64 *)malloc((long)(iVar3 << 6));
  if (iVar3 < 0) {
    __assert_fail("(entry < m_size) || ((m_size == 0) && (entry == 0))",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgStack.h"
                  ,0x60,"T &dgStack<dgBigVector>::operator[](hacd::HaI32) [T = dgBigVector]");
  }
  iVar9 = (this->super_dgPolyhedra).m_edgeMark + 1;
  (this->super_dgPolyhedra).m_edgeMark = iVar9;
  if (iVar9 != 0x7fffffff) {
    local_40.m_ptr = (dgRedBackNode *)0x0;
    this_00 = (this->super_dgPolyhedra).super_dgTree<dgEdge,_long>.m_head;
    count = 0;
    local_40.m_tree = (dgTree<dgEdge,_long> *)this;
    if (this_00 == (dgTreeNode *)0x0) {
      local_40.m_ptr = (dgRedBackNode *)0x0;
    }
    else {
      local_40.m_ptr = dgRedBackNode::Minimum(&this_00->super_dgRedBackNode);
    }
    while (local_40.m_ptr != (dgRedBackNode *)0x0) {
      if (*(int *)&local_40.m_ptr[2]._vptr_dgRedBackNode != iVar9) {
        pdVar7 = local_40.m_ptr + 1;
        pdVar8 = pdVar7;
        do {
          *(int *)&pdVar8[1]._vptr_dgRedBackNode = iVar9;
          pdVar8 = *(dgRedBackNode **)(*(long *)&pdVar8->field_0x20 + 0x10);
        } while (pdVar8 != pdVar7);
        if (count < iVar3 * 2) {
          pdVar1 = this->m_points + *(int *)&pdVar7->_vptr_dgRedBackNode;
          HVar4 = (HaF64)(pdVar1->super_dgTemplateVector<double>).m_y;
          HVar5 = (HaF64)(pdVar1->super_dgTemplateVector<double>).m_z;
          HVar6 = (HaF64)(pdVar1->super_dgTemplateVector<double>).m_w;
          pHVar2 = vertexCloud + (long)count * 4;
          *pHVar2 = (HaF64)(pdVar1->super_dgTemplateVector<double>).m_x;
          pHVar2[1] = HVar4;
          pHVar2[2] = HVar5;
          pHVar2[3] = HVar6;
          count = count + 1;
        }
      }
      dgTree<dgEdge,_long>::Iterator::operator++(&local_40,0);
    }
    this_01 = (dgConvexHull3d *)malloc(0x48);
    dgConvexHull3d::dgConvexHull3d(this_01,vertexCloud,0x20,count,tolerance,maxVertexCount);
    free(vertexCloud);
    return this_01;
  }
  __assert_fail("m_edgeMark < 0x7fffffff",
                "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgPolyhedra.h"
                ,0xe5,"hacd::HaI32 dgPolyhedra::IncLRU() const");
}

Assistant:

dgConvexHull3d * dgMeshEffect::CreateConvexHull(hacd::HaF64 tolerance,hacd::HaI32 maxVertexCount) const
{
	dgConvexHull3d *ret = NULL;

	dgStack<dgBigVector> poolPtr(m_pointCount * 2); 
	dgBigVector* const pool = &poolPtr[0];

	hacd::HaI32 count = 0;
	hacd::HaI32 mark = IncLRU();
	dgPolyhedra::Iterator iter (*this);
	for (iter.Begin(); iter; iter ++)
	{
		dgEdge* const vertex = &(*iter);
		if (vertex->m_mark != mark) 
		{
			dgEdge* ptr = vertex;
			do {
				ptr->m_mark = mark;
				ptr = ptr->m_twin->m_next;
			} while (ptr != vertex);

			if (count < hacd::HaI32 (poolPtr.GetElementsCount())) 
			{
				const dgBigVector p = m_points[vertex->m_incidentVertex];
				pool[count] = p;
				count++;
			}
		}
	}

	ret = HACD_NEW(dgConvexHull3d)((const hacd::HaF64 *)pool,sizeof(dgBigVector),count,tolerance,maxVertexCount);

	return ret;
}